

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O0

QPalette * __thiscall QKdeTheme::palette(QKdeTheme *this,Palette type)

{
  bool bVar1;
  QKdeThemePrivate *this_00;
  QDebug *pQVar2;
  pointer pQVar3;
  undefined4 in_ESI;
  QPlatformTheme *in_RDI;
  long in_FS_OFFSET;
  QKdeThemePrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  QPlatformTheme *pQVar4;
  QDebug *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb8;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  this_00 = d_func((QKdeTheme *)0xadec94);
  bVar1 = QKdeThemePrivate::hasRequestedColorScheme(this_00);
  if (bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQpaThemeKde();
    anon_unknown.dwarf_1dab4db::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_1dab4db::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xaded02);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(char *)in_stack_ffffffffffffff68,
                 (char *)0xaded18);
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<((QDebug *)CONCAT44(in_ESI,in_stack_ffffffffffffff88),
                                  in_stack_ffffffffffffffb8);
      QDebug::QDebug(&local_38,pQVar2);
      ::operator<<(in_stack_ffffffffffffff98,(ColorScheme)((ulong)pQVar4 >> 0x20));
      pQVar2 = QDebug::operator<<((QDebug *)CONCAT44(in_ESI,in_stack_ffffffffffffff88),
                                  in_stack_ffffffffffffffb8);
      QDebug::QDebug(&local_28,pQVar2);
      ::operator<<(in_stack_ffffffffffffff98,(Palette)((ulong)pQVar4 >> 0x20));
      QDebug::~QDebug(&local_20);
      QDebug::~QDebug(&local_28);
      QDebug::~QDebug(&local_30);
      QDebug::~QDebug(&local_38);
      QDebug::~QDebug(&local_40);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    pQVar3 = QPlatformTheme::palette(in_RDI,(Palette)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  else {
    pQVar3 = std::unique_ptr<QPalette,_std::default_delete<QPalette>_>::get
                       ((unique_ptr<QPalette,_std::default_delete<QPalette>_> *)0xadedf5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

const QPalette *QKdeTheme::palette(Palette type) const
{
    Q_D(const QKdeTheme);
    if (d->hasRequestedColorScheme()) {
        qCDebug(lcQpaThemeKde) << "Current KDE theme doesn't support reuqested color scheme"
                               << d->m_requestedColorScheme << "Falling back to fusion palette:"
                               << type;
        return QPlatformTheme::palette(type);
    }

    return d->systemPalette.get();
}